

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O0

void __thiscall ByteString::ByteString(ByteString *this,unsigned_long longValue)

{
  reference pvVar1;
  ulong in_RSI;
  undefined8 *in_RDI;
  size_t i;
  uchar byteStrIn [8];
  unsigned_long setValue;
  ulong __new_size;
  vector<unsigned_char,_SecureAllocator<unsigned_char>_> *in_stack_ffffffffffffffe0;
  ulong local_18;
  
  *in_RDI = &PTR__ByteString_0017cc58;
  std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)0x13ca23);
  local_18 = in_RSI;
  for (__new_size = 0; __new_size < 8; __new_size = __new_size + 1) {
    (&stack0xffffffffffffffe7)[-__new_size] = (char)local_18;
    local_18 = local_18 >> 8;
  }
  std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffffe0,__new_size);
  pvVar1 = std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)(in_RDI + 1),0);
  *(vector<unsigned_char,_SecureAllocator<unsigned_char>_> **)pvVar1 = in_stack_ffffffffffffffe0;
  return;
}

Assistant:

ByteString::ByteString(const unsigned long longValue)
{
	unsigned long setValue = longValue;

	// Convert the value to a big-endian byte string; N.B.: this code assumes that unsigned long
	// values are stored as a 64-bit value, which is a safe assumption on modern systems. It will
	// also properly handle a 32-bit value and will simply store 4 zeroes at the front of the
	// string. If at some point in time we get 128-bit architectures, the top 8 bytes of the value
	// will be discarded... (but hey, 640K is enough for everybody, right?)
	//
	// The reason for coding it this way is that implementations of SoftHSM will maintain
	// binary compatibility between eachothers background storage (i.e. a 32-bit SoftHSM version can
	// read the storage of a 64-bit version and vice versa under the assumption that the stored
	// values never exceed 32-bits, which is likely since these values are only used to encode
	// byte string lengths)
	unsigned char byteStrIn[8];
	
	for (size_t i = 0; i < 8; i++)
	{
		byteStrIn[7-i] = (unsigned char) (setValue & 0xFF);
		setValue >>= 8;
	}

	byteString.resize(8);
	memcpy(&byteString[0], byteStrIn, 8);
}